

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Pprof.cpp
# Opt level: O2

char * __thiscall Vault::Sys::Pprof::index_abi_cxx11_(Pprof *this,char *__s,int __c)

{
  Client *client;
  Path local_50;
  Url local_30;
  
  client = *(Client **)__s;
  local_50.value_._M_dataplus._M_p = (pointer)&local_50.value_.field_2;
  local_50.value_.field_2._M_allocated_capacity = 0;
  local_50.value_.field_2._8_8_ = 0;
  local_50.value_._M_string_length = 0;
  getUrl(&local_30,(Pprof *)__s,&local_50);
  HttpConsumer::get((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)this,client,&local_30);
  std::__cxx11::string::~string((string *)&local_30);
  std::__cxx11::string::~string((string *)&local_50);
  return (char *)this;
}

Assistant:

std::optional<std::string> Vault::Sys::Pprof::index() {
  return HttpConsumer::get(client_, getUrl(Path{}));
}